

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O0

void sbfTcpConnection_destroy(sbfTcpConnection_conflict tc)

{
  int iVar1;
  undefined8 *in_RDI;
  
  sbfLog_log(*in_RDI,0,"destroying TCP connection %p",in_RDI);
  *(undefined4 *)(in_RDI + 0x18) = 1;
  evutil_closesocket(*(undefined4 *)(in_RDI + 1));
  if (in_RDI[2] != 0) {
    bufferevent_free(in_RDI[2]);
  }
  iVar1 = sbfRefCount_decrement((sbfRefCount *)((long)in_RDI + 0xc4));
  if (iVar1 != 0) {
    free(in_RDI);
  }
  return;
}

Assistant:

void
sbfTcpConnection_destroy (sbfTcpConnection tc)
{
    sbfLog_debug (tc->mLog, "destroying TCP connection %p", tc);

    tc->mDestroyed = 1;
    EVUTIL_CLOSESOCKET (tc->mSocket);
    if (tc->mEvent != NULL)
        bufferevent_free (tc->mEvent);

    if (sbfRefCount_decrement (&tc->mRefCount))
        free (tc);
}